

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::WriteExports(CWriter *this,CWriterPhase kind)

{
  bool bVar1;
  int iVar2;
  Export *pEVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer ppMVar6;
  Type *pTVar7;
  SymbolMap *this_00;
  Index IVar8;
  Func *pFVar9;
  Memory *pMVar10;
  Global *pGVar11;
  Table *pTVar12;
  const_iterator cVar13;
  uint *in_RCX;
  char (*u) [5];
  Newline *extraout_RDX;
  Newline *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  Newline *extraout_RDX_01;
  Newline *extraout_RDX_02;
  Newline *extraout_RDX_03;
  Newline *extraout_RDX_04;
  Newline *extraout_RDX_05;
  Newline *extraout_RDX_06;
  Newline *extraout_RDX_07;
  Newline *extraout_RDX_08;
  ExternalInstancePtr *extraout_RDX_09;
  ExternalInstancePtr *extraout_RDX_10;
  ExternalInstancePtr *extraout_RDX_11;
  ExternalInstancePtr *u_00;
  Newline *u_01;
  Newline *extraout_RDX_12;
  Newline *extraout_RDX_13;
  Newline *extraout_RDX_14;
  Newline *extraout_RDX_15;
  Newline *extraout_RDX_16;
  Newline *extraout_RDX_17;
  Newline *pNVar15;
  pointer ppEVar16;
  char *pcVar17;
  string *t;
  Newline *in_R8;
  long lVar18;
  Index i;
  ulong uVar19;
  string_view str;
  string_view export_name;
  string internal_name;
  string mangled_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_to_name;
  string local_128;
  CWriterPhase local_104;
  key_type local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  _Base_ptr local_d8;
  StackVarSymbolMap *local_d0;
  _Base_ptr local_c8;
  SymbolMap *local_c0;
  string local_b8;
  _Base_ptr local_98;
  SymbolMap *local_90;
  SymbolSet *local_88;
  SymbolSet *local_80;
  ulong local_78;
  pointer local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppEVar16 = (this->module_->exports).
             super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_70 = (this->module_->exports).
             super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppEVar16 != local_70) {
    local_e0 = &this->module_prefix_;
    local_80 = &this->global_syms_;
    local_88 = &this->local_syms_;
    local_c0 = &this->local_sym_map_;
    local_c8 = &(this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d0 = &this->stack_var_sym_map_;
    local_d8 = &(this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_90 = &this->import_module_sym_map_;
    local_98 = &(this->import_module_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_104 = kind;
    do {
      pEVar3 = *ppEVar16;
      str._M_str = (char *)in_RCX;
      str._M_len = (size_t)(pEVar3->name)._M_dataplus._M_p;
      (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                (&local_128,(_anonymous_namespace_ *)(pEVar3->name)._M_string_length,str);
      if (this->consecutive_newline_count_ < 2) {
        WriteData(this,"\n",1);
        this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      }
      this->should_write_indent_next_ = true;
      WriteData(this,"/* export: \'",0xc);
      (anonymous_namespace)::CWriter::
      Write<std::__cxx11::string,char_const(&)[5],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,&local_128,u,(Newline *)in_RCX);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      export_name._M_str = (pEVar3->name)._M_dataplus._M_p;
      export_name._M_len = (pEVar3->name)._M_string_length;
      (anonymous_namespace)::CWriter::ExportName_abi_cxx11_(&local_b8,(CWriter *)this,export_name);
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_100._M_string_length = 0;
      local_100.field_2._M_local_buf[0] = '\0';
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      in_RCX = &switchD_00144fb3::switchdataD_0017027c;
      switch(pEVar3->kind) {
      case First:
        pFVar9 = Module::GetFunc(this->module_,&pEVar3->var);
        std::__cxx11::string::_M_assign((string *)&local_100);
        if (kind == Declarations) {
          WriteFuncDeclaration(this,&pFVar9->decl,&local_b8);
          pNVar15 = extraout_RDX_07;
        }
        else {
          this->func_ = pFVar9;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&local_88->_M_t,&local_80->_M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase(&local_c0->_M_t,
                     (_Link_type)
                     (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_c8;
          (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_c8;
          (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          std::
          _Rb_tree<std::pair<unsigned_int,_wabt::Type>,_std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase(&local_d0->_M_t,
                     (_Link_type)
                     (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent);
          (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_d8
          ;
          (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_d8;
          (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          (anonymous_namespace)::CWriter::
          Write<std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
                    ((CWriter *)this,&(this->func_->decl).sig.result_types,(char (*) [2])&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX,
                     (char (*) [2])in_R8);
          pFVar9 = this->func_;
          pTVar4 = (pFVar9->decl).sig.param_types.
                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pTVar5 = (pFVar9->decl).sig.param_types.
                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                   super__Vector_impl_data._M_start;
          IVar8 = LocalTypes::size(&pFVar9->local_types);
          MakeTypeBindingReverseMapping
                    ((ulong)((int)((ulong)((long)pTVar4 - (long)pTVar5) >> 3) + IVar8),
                     &this->func_->bindings,&local_68);
          WriteParams(this,&local_68,false);
          pNVar15 = extraout_RDX;
        }
        break;
      case Table:
        pTVar12 = Module::GetTable(this->module_,&pEVar3->var);
        std::__cxx11::string::_M_assign((string *)&local_100);
        WriteTableType(this,&pTVar12->elem_type);
        std::operator+(&local_128,"w2c_",local_e0);
        WriteData(this,"* ",2);
        WriteData(this,local_b8._M_dataplus._M_p,local_b8._M_string_length);
        WriteData(this,"(",1);
        WriteData(this,local_128._M_dataplus._M_p,local_128._M_string_length);
        WriteData(this,"* instance)",0xb);
        pNVar15 = extraout_RDX_05;
        goto LAB_0014531d;
      case Memory:
        pMVar10 = Module::GetMemory(this->module_,&pEVar3->var);
        std::__cxx11::string::_M_assign((string *)&local_100);
        bVar1 = (pMVar10->page_limits).is_shared;
        pcVar17 = "wasm_rt_memory_t";
        if (bVar1 != false) {
          pcVar17 = "wasm_rt_shared_memory_t";
        }
        in_RCX = (uint *)(pcVar17 + 0x17);
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (pcVar17 + 0x10);
        if (bVar1 != false) {
          pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX;
        }
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,pcVar17,pbVar14);
        std::operator+(&local_50,"w2c_",local_e0);
        WriteData(this,local_128._M_dataplus._M_p,local_128._M_string_length);
        WriteData(this,"* ",2);
        (anonymous_namespace)::CWriter::
        Write<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[12]>
                  ((CWriter *)this,&local_b8,(char (*) [2])&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX,
                   (char (*) [12])in_R8);
        pNVar15 = extraout_RDX_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          pNVar15 = extraout_RDX_02;
        }
        kind = local_104;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          pNVar15 = extraout_RDX_03;
          kind = local_104;
        }
        break;
      case Global:
        pGVar11 = Module::GetGlobal(this->module_,&pEVar3->var);
        std::__cxx11::string::_M_assign((string *)&local_100);
        std::operator+(&local_128,"w2c_",local_e0);
        Write(this,pGVar11->type);
        WriteData(this,"* ",2);
        (anonymous_namespace)::CWriter::
        Write<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[12]>
                  ((CWriter *)this,&local_b8,(char (*) [2])&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX,
                   (char (*) [12])in_R8);
        pNVar15 = extraout_RDX_04;
LAB_0014531d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          pNVar15 = extraout_RDX_06;
        }
        break;
      case Last:
        Module::GetTag(this->module_,&pEVar3->var);
        std::__cxx11::string::_M_assign((string *)&local_100);
        if (kind == Declarations) {
          WriteData(this,"extern ",7);
        }
        WriteData(this,"const wasm_rt_tag_t ",0x14);
        WriteData(this,local_b8._M_dataplus._M_p,local_b8._M_string_length);
        pNVar15 = extraout_RDX_00;
        break;
      default:
        goto switchD_00144fb3_default;
      }
      if (kind == Declarations) {
LAB_0014543a:
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [2])0x171bb9,pNVar15);
      }
      else {
        WriteData(this," ",1);
        in_RCX = &switchD_00145386::switchdataD_00170290;
        switch(pEVar3->kind) {
        case First:
          Write(this);
          ppMVar6 = (this->module_->memories).
                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((long)(this->module_->memories).
                     super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppMVar6 == 8) &&
             (((*ppMVar6)->page_limits).is_shared == false)) {
            InstallSegueBase(this,*ppMVar6,true);
          }
          pFVar9 = this->func_;
          pTVar7 = (pFVar9->decl).sig.result_types.
                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_78 = (ulong)((long)(pFVar9->decl).sig.result_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar7) >> 3;
          if ((uint)local_78 < 2) {
            if ((uint)local_78 == 1) {
              Write(this,*pTVar7);
              goto LAB_001454b1;
            }
          }
          else {
            Write(this,&(pFVar9->decl).sig.result_types);
LAB_001454b1:
            WriteData(this," ret = ",7);
          }
          local_128._M_dataplus._M_p = local_128._M_dataplus._M_p & 0xffffffff00000000;
          local_128._M_string_length = (size_type)&local_100;
          Write(this,(ExternalRef *)&local_128);
          WriteData(this,"(",1);
          this_00 = local_90;
          cVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&local_90->_M_t,&local_100);
          if (cVar13._M_node == local_98) {
            WriteData(this,"instance",8);
            pNVar15 = extraout_RDX_13;
          }
          else {
            local_128._M_string_length =
                 (size_type)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_00,&local_100);
            local_128._M_dataplus._M_p._0_4_ = 2;
            WriteData(this,"instance->",10);
            Write(this,(GlobalName *)&local_128);
            pNVar15 = extraout_RDX_12;
          }
          if ((int)((ulong)((long)(this->func_->decl).sig.param_types.
                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->func_->decl).sig.param_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 3) != 0) {
            this->indent_ = this->indent_ + 4;
            lVar18 = 0;
            uVar19 = 0;
            do {
              WriteData(this,", ",2);
              if ((uVar19 & 7) == 0 && uVar19 != 0) {
                if (this->consecutive_newline_count_ < 2) {
                  WriteData(this,"\n",1);
                  this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
                }
                this->should_write_indent_next_ = true;
              }
              local_128._M_dataplus._M_p =
                   (pointer)((long)&((local_68.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar18);
              Write(this,(ParamName *)&local_128);
              uVar19 = uVar19 + 1;
              lVar18 = lVar18 + 0x20;
            } while (uVar19 < ((ulong)((long)(this->func_->decl).sig.param_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->func_->decl).sig.param_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3 &
                              0xffffffff));
            iVar2 = this->indent_;
            this->indent_ = iVar2 + -4;
            pNVar15 = extraout_RDX_14;
            if (iVar2 < 4) {
              __assert_fail("indent_ >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                            ,0x41c,"void wabt::(anonymous namespace)::CWriter::Dedent(int)");
            }
          }
          pcVar17 = ");";
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(char (*) [3])0x172a57,pNVar15);
          ppMVar6 = (this->module_->memories).
                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          in_RCX = (uint *)((long)(this->module_->memories).
                                  super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6);
          pNVar15 = extraout_RDX_15;
          if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX ==
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8) &&
             (((*ppMVar6)->page_limits).is_shared == false)) {
            RestoreSegueBase(this);
            pNVar15 = extraout_RDX_16;
          }
          if ((int)local_78 != 0) {
            pcVar17 = "return ret;";
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[12],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)this,(char (*) [12])"return ret;",pNVar15);
            pNVar15 = extraout_RDX_17;
          }
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)this,(CloseBrace *)pcVar17,pNVar15);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase(&local_c0->_M_t,
                     (_Link_type)
                     (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
          (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_c8;
          (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_c8;
          (this->local_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          std::
          _Rb_tree<std::pair<unsigned_int,_wabt::Type>,_std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase(&local_d0->_M_t,
                     (_Link_type)
                     (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent);
          (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_d8
          ;
          (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_d8;
          (this->stack_var_sym_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          this->func_ = (Func *)0x0;
          kind = local_104;
          goto LAB_00145700;
        case Table:
          Write(this);
          local_128._M_dataplus._M_p._0_4_ = 5;
          u_00 = extraout_RDX_11;
          break;
        case Memory:
          Write(this);
          local_128._M_dataplus._M_p._0_4_ = 7;
          u_00 = extraout_RDX_09;
          break;
        case Global:
          Write(this);
          local_128._M_dataplus._M_p._0_4_ = 1;
          u_00 = extraout_RDX_10;
          break;
        case Last:
          local_128._M_dataplus._M_p._0_4_ = 10;
          local_128._M_string_length = (size_type)&local_100;
          WriteData(this,"= ",2);
          Write(this,(TagSymbol *)&local_128);
          pNVar15 = extraout_RDX_08;
          goto LAB_0014543a;
        default:
switchD_00144fb3_default:
          abort();
        }
        local_128._M_string_length = (size_type)&local_100;
        t = &local_128;
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[8],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(char (*) [8])&local_128,u_00,(char (*) [2])in_RCX,in_R8);
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,(CloseBrace *)t,u_01);
      }
LAB_00145700:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,
                        CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                                 local_100.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      ppEVar16 = ppEVar16 + 1;
    } while (ppEVar16 != local_70);
  }
  return;
}

Assistant:

void CWriter::WriteExports(CWriterPhase kind) {
  if (module_->exports.empty())
    return;

  for (const Export* export_ : module_->exports) {
    Write(Newline(), "/* export: '", SanitizeForComment(export_->name), "' */",
          Newline());

    const std::string mangled_name = ExportName(export_->name);
    std::string internal_name;
    std::vector<std::string> index_to_name;

    switch (export_->kind) {
      case ExternalKind::Func: {
        const Func* func = module_->GetFunc(export_->var);
        internal_name = func->name;
        if (kind == CWriterPhase::Declarations) {
          WriteFuncDeclaration(func->decl, mangled_name);
        } else {
          func_ = func;
          local_syms_ = global_syms_;
          local_sym_map_.clear();
          stack_var_sym_map_.clear();
          Write(func_->decl.sig.result_types, " ", mangled_name, "(");
          MakeTypeBindingReverseMapping(func_->GetNumParamsAndLocals(),
                                        func_->bindings, &index_to_name);
          WriteParams(index_to_name);
        }
        break;
      }

      case ExternalKind::Global: {
        const Global* global = module_->GetGlobal(export_->var);
        internal_name = global->name;
        WriteGlobalPtr(*global, mangled_name);
        break;
      }

      case ExternalKind::Memory: {
        const Memory* memory = module_->GetMemory(export_->var);
        internal_name = memory->name;
        WriteMemoryPtr(mangled_name, *memory);
        break;
      }

      case ExternalKind::Table: {
        const Table* table = module_->GetTable(export_->var);
        internal_name = table->name;
        WriteTablePtr(mangled_name, *table);
        break;
      }

      case ExternalKind::Tag: {
        const Tag* tag = module_->GetTag(export_->var);
        internal_name = tag->name;
        if (kind == CWriterPhase::Declarations) {
          Write("extern ");
        }
        Write("const wasm_rt_tag_t ", mangled_name);
        break;
      }

      default:
        WABT_UNREACHABLE;
    }

    if (kind == CWriterPhase::Declarations) {
      Write(";", Newline());
      continue;
    }

    Write(" ");
    switch (export_->kind) {
      case ExternalKind::Func: {
        Write(OpenBrace());
        if (IsSingleUnsharedMemory()) {
          InstallSegueBase(module_->memories[0], true /* save_old_value */);
        }
        auto num_results = func_->GetNumResults();
        if (num_results > 1) {
          Write(func_->decl.sig.result_types, " ret = ");
        } else if (num_results == 1) {
          Write(func_->GetResultType(0), " ret = ");
        }
        Write(ExternalRef(ModuleFieldType::Func, internal_name), "(");

        if (IsImport(internal_name)) {
          Write("instance->",
                GlobalName(ModuleFieldType::Import,
                           import_module_sym_map_[internal_name]));
        } else {
          Write("instance");
        }
        WriteParamSymbols(index_to_name);
        if (IsSingleUnsharedMemory()) {
          RestoreSegueBase();
        }
        if (num_results > 0) {
          Write("return ret;", Newline());
        }
        Write(CloseBrace(), Newline());

        local_sym_map_.clear();
        stack_var_sym_map_.clear();
        func_ = nullptr;
        break;
      }

      case ExternalKind::Global:
        Write(OpenBrace());
        Write("return ",
              ExternalInstancePtr(ModuleFieldType::Global, internal_name), ";",
              Newline());
        Write(CloseBrace(), Newline());
        break;

      case ExternalKind::Memory:
        Write(OpenBrace());
        Write("return ",
              ExternalInstancePtr(ModuleFieldType::Memory, internal_name), ";",
              Newline());
        Write(CloseBrace(), Newline());
        break;

      case ExternalKind::Table:
        Write(OpenBrace());
        Write("return ",
              ExternalInstancePtr(ModuleFieldType::Table, internal_name), ";",
              Newline());
        Write(CloseBrace(), Newline());
        break;

      case ExternalKind::Tag:
        Write("= ", TagSymbol(internal_name), ";", Newline());
        break;

      default:
        WABT_UNREACHABLE;
    }
  }
}